

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.hpp
# Opt level: O0

SPIRVShaderStageInputAttribs * __thiscall
Diligent::SPIRVShaderResources::GetShaderStageInputAttribs(SPIRVShaderResources *this,Uint32 n)

{
  Char *Message;
  pointer pvVar1;
  unsigned_short *in_R9;
  SPIRVShaderResourceAttribs *ResourceMemoryEnd;
  string msg;
  Uint32 n_local;
  SPIRVShaderResources *this_local;
  
  msg.field_2._12_4_ = n;
  if (this->m_NumShaderStageInputs <= n) {
    FormatString<char[27],unsigned_int,char[39],unsigned_short>
              ((string *)&ResourceMemoryEnd,(Diligent *)"Shader stage input index (",
               (char (*) [27])((long)&msg.field_2 + 0xc),
               (uint *)") is out of range. Total input count: ",
               (char (*) [39])&this->m_NumShaderStageInputs,in_R9);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderStageInputAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0xc4);
    std::__cxx11::string::~string((string *)&ResourceMemoryEnd);
  }
  pvVar1 = std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                     (&this->m_MemoryBuffer);
  return (SPIRVShaderStageInputAttribs *)
         ((long)pvVar1 +
         (ulong)(uint)msg.field_2._12_4_ * 0x10 + (long)(int)(uint)this->m_TotalResources * 0x20);
}

Assistant:

const SPIRVShaderStageInputAttribs& GetShaderStageInputAttribs(Uint32 n) const noexcept
    {
        VERIFY(n < m_NumShaderStageInputs, "Shader stage input index (", n, ") is out of range. Total input count: ", m_NumShaderStageInputs);
        auto* ResourceMemoryEnd = reinterpret_cast<const SPIRVShaderResourceAttribs*>(m_MemoryBuffer.get()) + m_TotalResources;
        return reinterpret_cast<const SPIRVShaderStageInputAttribs*>(ResourceMemoryEnd)[n];
    }